

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O3

void Internal_DimStyleInit(wchar_t *name,int index,ON_UUID id,ON_DimStyle *dimension_style)

{
  Internal_SystemModelComponentInit(id,index,name,&dimension_style->super_ON_ModelComponent);
  ON_DimStyle::SetAlternatePrefix(dimension_style,L" [");
  ON_DimStyle::SetAlternateSuffix(dimension_style,L"]");
  ON_DimStyle::SetFont(dimension_style,&ON_Font::Default);
  ON_DimStyle::SetDimTextLocation(dimension_style,AboveDimLine);
  return;
}

Assistant:

static void Internal_DimStyleInit(
  const wchar_t* name,
  int index,
  ON_UUID id,
  ON_DimStyle& dimension_style
  )
{
  Internal_SystemModelComponentInit(id, index, name, dimension_style);

  dimension_style.SetAlternatePrefix(L" [");
  dimension_style.SetAlternateSuffix(L"]");
  // identical values for most or all built-in dimension styles
  dimension_style.SetFont(ON_Font::Default);
  dimension_style.SetDimTextLocation(ON_DimStyle::TextLocation::AboveDimLine);
}